

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O2

int idaLsJacBWrapper(sunrealtype tt,sunrealtype c_jB,N_Vector yyB,N_Vector ypB,N_Vector rrB,
                    SUNMatrix JacB,void *ida_mem,N_Vector tmp1B,N_Vector tmp2B,N_Vector tmp3B)

{
  IDAadjMem pIVar1;
  int iVar2;
  IDABMem IDAB_mem;
  sunrealtype local_50;
  IDALsMemB idalsB_mem;
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  
  IDA_mem = (IDAMem)0x0;
  IDAADJ_mem = (IDAadjMem)0x0;
  idalsB_mem = (IDALsMemB)0x0;
  IDAB_mem = (IDABMem)0x0;
  local_50 = c_jB;
  idaLs_AccessLMemBCur(ida_mem,"idaLsJacBWrapper",&IDA_mem,&IDAADJ_mem,&IDAB_mem,&idalsB_mem);
  pIVar1 = IDAADJ_mem;
  if ((IDAADJ_mem->ia_noInterp == 0) &&
     (iVar2 = (*IDAADJ_mem->ia_getY)
                        (IDA_mem,tt,IDAADJ_mem->ia_yyTmp,IDAADJ_mem->ia_ypTmp,(N_Vector *)0x0,
                         (N_Vector *)0x0), iVar2 != 0)) {
    IDAProcessError(IDAB_mem->IDA_mem,-1,0x8a2,"idaLsJacBWrapper",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                    ,"Bad t for interpolation.");
    return -1;
  }
  iVar2 = (*idalsB_mem->jacB)(tt,local_50,pIVar1->ia_yyTmp,pIVar1->ia_ypTmp,yyB,ypB,rrB,JacB,
                              IDAB_mem->ida_user_data,tmp1B,tmp2B,tmp3B);
  return iVar2;
}

Assistant:

static int idaLsJacBWrapper(sunrealtype tt, sunrealtype c_jB, N_Vector yyB,
                            N_Vector ypB, N_Vector rrB, SUNMatrix JacB,
                            void* ida_mem, N_Vector tmp1B, N_Vector tmp2B,
                            N_Vector tmp3B)
{
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  IDABMem IDAB_mem;
  IDALsMemB idalsB_mem;
  int retval;

  /* access relevant memory structures */
  IDA_mem    = NULL;
  IDAADJ_mem = NULL;
  idalsB_mem = NULL;
  IDAB_mem   = NULL;
  retval     = idaLs_AccessLMemBCur(ida_mem, __func__, &IDA_mem, &IDAADJ_mem,
                                    &IDAB_mem, &idalsB_mem);

  /* Forward solution from interpolation */
  if (IDAADJ_mem->ia_noInterp == SUNFALSE)
  {
    retval = IDAADJ_mem->ia_getY(IDA_mem, tt, IDAADJ_mem->ia_yyTmp,
                                 IDAADJ_mem->ia_ypTmp, NULL, NULL);
    if (retval != IDA_SUCCESS)
    {
      IDAProcessError(IDAB_mem->IDA_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_LS_BAD_T);
      return (-1);
    }
  }

  /* Call user's adjoint jacB routine */
  return (idalsB_mem->jacB(tt, c_jB, IDAADJ_mem->ia_yyTmp, IDAADJ_mem->ia_ypTmp,
                           yyB, ypB, rrB, JacB, IDAB_mem->ida_user_data, tmp1B,
                           tmp2B, tmp3B));
}